

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

SampledSpectrum * __thiscall pbrt::SampledSpectrum::operator/=(SampledSpectrum *this,Float a)

{
  float *pfVar1;
  SampledSpectrum *in_RDI;
  float in_XMM0_Da;
  int i;
  undefined4 local_10;
  
  for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
    pfVar1 = pstd::array<float,_4>::operator[](&in_RDI->values,(long)local_10);
    *pfVar1 = *pfVar1 / in_XMM0_Da;
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    SampledSpectrum &operator/=(Float a) {
        DCHECK_NE(a, 0);
        DCHECK(!IsNaN(a));
        for (int i = 0; i < NSpectrumSamples; ++i)
            values[i] /= a;
        return *this;
    }